

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O0

bool Test::run_tests(void)

{
  Test *pTVar1;
  bool bVar2;
  Registry *pRVar3;
  reference ppTVar4;
  size_type sVar5;
  ostream *poVar6;
  reference ppVar7;
  char *pcVar8;
  Mark *mark;
  iterator __end2;
  iterator __begin2;
  list<std::pair<const_char_*,_int>,_std::allocator<std::pair<const_char_*,_int>_>_> *__range2;
  exception *e;
  bool ret;
  Test *test;
  iterator __end1;
  iterator __begin1;
  list<Test_*,_std::allocator<Test_*>_> *__range1;
  bool success;
  
  __range1._7_1_ = true;
  pRVar3 = Registry::getInstance();
  __end1 = std::__cxx11::list<Test_*,_std::allocator<Test_*>_>::begin(&pRVar3->tests);
  test = (Test *)std::__cxx11::list<Test_*,_std::allocator<Test_*>_>::end(&pRVar3->tests);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&test), bVar2) {
    ppTVar4 = std::_List_iterator<Test_*>::operator*(&__end1);
    pTVar1 = *ppTVar4;
    poVar6 = std::operator<<((ostream *)&std::cout,"Testing: ");
    poVar6 = std::operator<<(poVar6,pTVar1->description);
    poVar6 = std::operator<<(poVar6,"... ");
    std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
    bVar2 = std::function<bool_()>::operator()(&pTVar1->body);
    pcVar8 = "FAILED!";
    if (bVar2) {
      pcVar8 = "Ok.";
    }
    poVar6 = std::operator<<((ostream *)&std::cout,pcVar8);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    __range1._7_1_ = (__range1._7_1_ & bVar2) != 0;
    std::_List_iterator<Test_*>::operator++(&__end1);
  }
  pRVar3 = Registry::getInstance();
  sVar5 = std::__cxx11::
          list<std::pair<const_char_*,_int>,_std::allocator<std::pair<const_char_*,_int>_>_>::size
                    (&pRVar3->marks);
  if (sVar5 != 0) {
    poVar6 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(poVar6,"Marked lines:");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pRVar3 = Registry::getInstance();
    __end2 = std::__cxx11::
             list<std::pair<const_char_*,_int>,_std::allocator<std::pair<const_char_*,_int>_>_>::
             begin(&pRVar3->marks);
    mark = (Mark *)std::__cxx11::
                   list<std::pair<const_char_*,_int>,_std::allocator<std::pair<const_char_*,_int>_>_>
                   ::end(&pRVar3->marks);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&mark), bVar2) {
      ppVar7 = std::_List_iterator<std::pair<const_char_*,_int>_>::operator*(&__end2);
      poVar6 = std::operator<<((ostream *)&std::cout,ppVar7->first);
      poVar6 = std::operator<<(poVar6,':');
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,ppVar7->second);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::_List_iterator<std::pair<const_char_*,_int>_>::operator++(&__end2);
    }
  }
  return __range1._7_1_;
}

Assistant:

bool Test::run_tests()
{
	using namespace std;

	bool success = true;
	for (Test *test : Registry::getInstance().tests)
	{
		cout << "Testing: " << test->description << "... " << flush;
		bool ret = false;
		try
		{
			ret = test->body();
			cout << (ret ? "Ok." : "FAILED!") << endl;
		}
		catch (std::exception &e)
			{ cout << "FAILED!" << endl << '\t' << e.what() << endl; }
		catch (...)
			{ cout << "FAILED!\n\tAn undetermined exception occurred!" << endl; }
		success &= ret;
	}

	if (Registry::getInstance().marks.size() > 0)
	{
		cout << endl << "Marked lines:" << endl;
		for (Registry::Mark &mark : Registry::getInstance().marks)
			cout << mark.first << ':' << mark.second << endl;
	}

	return success;
}